

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int fits_translate_pixkeyword
              (char *inrec,char *outrec,char *(*patterns) [2],int npat,int naxis,int *colnum,
              int *pat_num,int *i,int *j,int *n,int *m,int *l,int *status)

{
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  ushort **ppuVar8;
  byte bVar9;
  char cVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  byte bVar17;
  uint uVar18;
  byte *pbVar19;
  byte bVar20;
  long lVar21;
  byte local_8e;
  uint local_8c;
  uint local_88;
  int local_84;
  int local_80;
  uint local_7c;
  
  iVar13 = *status;
  if (iVar13 < 1) {
    if (inrec == (char *)0x0 || outrec == (char *)0x0) {
      *status = 0x73;
      iVar13 = 0x73;
    }
    else {
      *outrec = '\0';
      if (*inrec == '\0') {
        iVar13 = 0;
      }
      else {
        uVar15 = 0;
        uVar12 = (ulong)(uint)npat;
        if (npat < 1) {
          uVar12 = uVar15;
        }
        local_8e = 0x20;
        local_80 = 0;
        local_84 = 0;
        local_88 = 0;
        local_8c = 0;
        local_7c = 0;
        bVar9 = 0;
        bVar5 = false;
        bVar3 = false;
        for (; uVar15 != uVar12; uVar15 = uVar15 + 1) {
          pbVar19 = (byte *)patterns[uVar15][0];
          bVar1 = *pbVar19;
          if (bVar1 == 0x2a) {
            local_8e = 0x20;
            local_80 = 0;
            uVar12 = uVar15 & 0xffffffff;
            local_84 = 0;
            bVar5 = false;
            goto LAB_00132917;
          }
          if ((bVar3) && (bVar1 == bVar9)) {
            local_80 = 0;
            local_8e = 0x20;
            local_84 = 0;
            bVar5 = false;
            bVar3 = true;
          }
          else {
            bVar5 = true;
            local_8e = 0x20;
            lVar16 = 0;
            local_80 = 0;
            local_84 = 0;
            uVar18 = 0;
            bVar3 = true;
            bVar17 = bVar1;
            for (iVar13 = 0; (lVar21 = (long)iVar13, bVar9 = bVar1, bVar17 != 0 && (iVar13 < 8));
                iVar13 = iVar13 + 1) {
              bVar20 = inrec[lVar21];
              lVar14 = (long)(char)bVar20;
              uVar11 = local_88;
              bVar4 = local_8e;
              if (bVar17 == 0x6a) {
                ppuVar8 = __ctype_b_loc();
                if ((*(byte *)((long)*ppuVar8 + lVar14 * 2 + 1) & 8) == 0) {
LAB_001327c6:
                  local_88 = uVar11;
                  bVar4 = local_8e;
                  if (uVar18 == 0) goto LAB_00132817;
                }
                else {
                  local_84 = (char)bVar20 + -0x30;
                }
              }
              else {
                uVar7 = (uint)bVar17;
                if (uVar7 == 0x69) {
                  ppuVar8 = __ctype_b_loc();
                  if ((*(byte *)((long)*ppuVar8 + lVar14 * 2 + 1) & 8) == 0) goto LAB_001327c6;
                  local_80 = (char)bVar20 + -0x30;
                }
                else if (uVar7 - 0x6c < 3) {
LAB_0013266d:
                  ppuVar8 = __ctype_b_loc();
                  if ((*(byte *)((long)*ppuVar8 + lVar14 * 2 + 1) & 8) == 0) {
                    bVar5 = false;
                    goto LAB_001328e1;
                  }
                  iVar13 = iVar13 + -1;
                  uVar7 = 0;
                  for (; lVar21 < 8; lVar21 = lVar21 + 1) {
                    if ((*(byte *)((long)*ppuVar8 + (long)(char)bVar20 * 2 + 1) & 8) == 0)
                    goto LAB_001326fa;
                    uVar7 = (uVar7 * 10 + (int)(char)bVar20) - 0x30;
                    bVar20 = inrec[lVar21 + 1];
                    iVar13 = iVar13 + 1;
                  }
                  iVar13 = 7;
LAB_001326fa:
                  if ((byte)(bVar17 + 0x93) < 2) {
                    if (uVar7 - 1 < 999) {
                      uVar18 = 1;
                      uVar11 = uVar18;
                      if (uVar7 != *colnum) {
                        uVar11 = 2;
                        uVar18 = 1;
                        if (uVar7 != colnum[1]) {
                          uVar11 = 3;
                          uVar18 = 1;
                          if (uVar7 != colnum[2]) {
                            uVar18 = (uint)(uVar7 == colnum[3]);
                            uVar11 = uVar18 * 4;
                          }
                        }
                      }
                      if (bVar17 != 0x6e) {
                        local_8c = uVar11;
                        uVar11 = local_88;
                      }
                      goto LAB_001327c6;
                    }
                    goto LAB_00132817;
                  }
                  if (bVar17 == 0x6c) {
                    local_7c = uVar7;
                  }
                }
                else if (uVar7 == 0x61) {
                  ppuVar8 = __ctype_b_loc();
                  bVar4 = bVar20;
                  if (((*(byte *)((long)*ppuVar8 + lVar14 * 2 + 1) & 1) == 0) && (bVar20 != 0x20))
                  goto LAB_001327c6;
                }
                else if (bVar17 != 0x3f) {
                  if (bVar17 == 0x23) goto LAB_0013266d;
                  if (bVar20 != bVar17) goto LAB_00132817;
                }
              }
              local_8e = bVar4;
              bVar17 = pbVar19[lVar16 + 1];
              lVar16 = lVar16 + 1;
              bVar5 = false;
              uVar18 = 1;
              bVar3 = false;
            }
            if (bVar5) {
LAB_00132817:
              bVar5 = false;
            }
            else {
              if (7 < iVar13) {
                bVar5 = false;
                uVar12 = uVar15 & 0xffffffff;
                goto LAB_00132917;
              }
              if (inrec[lVar21] == ' ') {
                bVar5 = false;
                uVar12 = uVar15 & 0xffffffff;
                goto LAB_00132917;
              }
              bVar5 = true;
            }
          }
LAB_001328e1:
        }
        bVar5 = !bVar5;
LAB_00132917:
        if (i != (int *)0x0) {
          *i = local_80;
        }
        if (j != (int *)0x0) {
          *j = local_84;
        }
        if (n != (int *)0x0) {
          *n = local_88;
        }
        if (m != (int *)0x0) {
          *m = local_8c;
        }
        if (l != (int *)0x0) {
          *l = local_7c;
        }
        if (pat_num != (int *)0x0) {
          *pat_num = (int)uVar12;
        }
        iVar13 = 0;
        if (!bVar5) {
          pcVar2 = patterns[uVar12][1];
          if ((*pcVar2 != '\0') && (*pcVar2 != '-')) {
            strcpy(outrec,inrec);
            cVar6 = *pcVar2;
            if (cVar6 != '+') {
              lVar16 = 0;
              iVar13 = 0;
              do {
                cVar10 = (char)local_80;
                if ((cVar6 == 'i') || (cVar10 = (char)local_84, cVar6 == 'j')) {
                  outrec[iVar13] = cVar10 + '0';
                }
                else {
                  lVar21 = (long)iVar13;
                  if (cVar6 == '\0') {
                    for (; lVar21 < 8; lVar21 = lVar21 + 1) {
                      outrec[lVar21] = ' ';
                    }
                    return *status;
                  }
                  if ((cVar6 == 'n') && (local_88 != 0)) {
                    for (uVar12 = 1; (int)(local_88 / uVar12) != 0;
                        uVar12 = (ulong)(uint)((int)uVar12 * 10)) {
                    }
                    iVar13 = iVar13 + -1;
                    pbVar19 = (byte *)(outrec + lVar21);
                    while (9 < (uint)uVar12) {
                      uVar12 = uVar12 / 10;
                      *pbVar19 = (byte)((local_88 / uVar12) % 10) | 0x30;
                      iVar13 = iVar13 + 1;
                      pbVar19 = pbVar19 + 1;
                    }
                  }
                  else if ((cVar6 == 'm') && (local_8c != 0)) {
                    for (uVar12 = 1; (int)(local_8c / uVar12) != 0;
                        uVar12 = (ulong)(uint)((int)uVar12 * 10)) {
                    }
                    iVar13 = iVar13 + -1;
                    pbVar19 = (byte *)(outrec + lVar21);
                    while (9 < (uint)uVar12) {
                      uVar12 = uVar12 / 10;
                      *pbVar19 = (byte)((local_8c / uVar12) % 10) | 0x30;
                      iVar13 = iVar13 + 1;
                      pbVar19 = pbVar19 + 1;
                    }
                  }
                  else if ((cVar6 == 'l') && (-1 < (int)local_7c)) {
                    for (uVar12 = 1; 0 < (int)(local_7c / uVar12);
                        uVar12 = (ulong)(uint)((int)uVar12 * 10)) {
                    }
                    iVar13 = iVar13 + -1;
                    pbVar19 = (byte *)(outrec + lVar21);
                    while (9 < (uint)uVar12) {
                      uVar12 = uVar12 / 10;
                      *pbVar19 = (byte)((local_7c / uVar12) % 10) | 0x30;
                      iVar13 = iVar13 + 1;
                      pbVar19 = pbVar19 + 1;
                    }
                  }
                  else if (cVar6 == 'a') {
                    outrec[lVar21] = local_8e;
                  }
                  else {
                    outrec[lVar21] = cVar6;
                  }
                }
                iVar13 = iVar13 + 1;
                cVar6 = pcVar2[lVar16 + 1];
                lVar16 = lVar16 + 1;
              } while( true );
            }
          }
        }
      }
    }
  }
  return iVar13;
}

Assistant:

int fits_translate_pixkeyword(
      char *inrec,        /* I - input string */
      char *outrec,       /* O - output converted string, or */
                          /*     a null string if input does not  */
                          /*     match any of the patterns */
      char *patterns[][2],/* I - pointer to input / output string */
                          /*     templates */
      int npat,           /* I - number of templates passed */
      int naxis,          /* I - number of columns to be binned */
      int *colnum,       /* I - numbers of the columns to be binned */
      int *pat_num,       /* O - matched pattern number (0 based) or -1 */
      int *i,
      int *j,
      int *n,
      int *m,
      int *l,
      int *status)        /* IO - error status */
      
/* 

Translate a keyword name to a new name, based on a set of patterns.
The user passes an array of patterns to be matched.  Input pattern
number i is pattern[i][0], and output pattern number i is
pattern[i][1].  Keywords are matched against the input patterns.  If a
match is found then the keyword is re-written according to the output
pattern.

Order is important.  The first match is accepted.  The fastest match
will be made when templates with the same first character are grouped
together.

Several characters have special meanings:

     i,j - single digits, preserved in output template
     n, m - column number of one or more digits, preserved in output template
     k - generic number of one or more digits, preserved in output template
     a - coordinate designator, preserved in output template
     # - number of one or more digits
     ? - any character
     * - only allowed in first character position, to match all
         keywords; only useful as last pattern in the list

i, j, n, and m are returned by the routine.

For example, the input pattern "iCTYPn" will match "1CTYP5" (if n_value
is 5); the output pattern "CTYPEi" will be re-written as "CTYPE1".
Notice that "i" is preserved.

The following output patterns are special

Special output pattern characters:

    "-" - do not copy a keyword that matches the corresponding input pattern

    "+" - copy the input unchanged

The inrec string could be just the 8-char keyword name, or the entire 
80-char header record.  Characters 9 = 80 in the input string simply get
appended to the translated keyword name.

If n_range = 0, then only keywords with 'n' equal to n_value will be 
considered as a pattern match.  If n_range = +1, then all values of 
'n' greater than or equal to n_value will be a match, and if -1, 
then values of 'n' less than or equal to n_value will match.

*/

{
    int i1 = 0, j1 = 0, val;
    int fac, nval = 0, mval = 0, lval = 0;
    char a = ' ';
    char oldp;
    char c, s;
    int ip, ic, pat, pass = 0, firstfail;
    char *spat;

    if (*status > 0)
        return(*status);

    if ((inrec == 0) || (outrec == 0)) 
      return (*status = NULL_INPUT_PTR);

    *outrec = '\0';
    if (*inrec == '\0') return 0;

    oldp = '\0';
    firstfail = 0;

    /* ===== Pattern match stage */
    for (pat=0; pat < npat; pat++) {

      spat = patterns[pat][0];
      
      i1 = 0; j1 = 0;   a = ' ';  /* Initialize the place-holders */
      pass = 0;
      
      /* Pass the wildcard pattern */
      if (spat[0] == '*') { 
	pass = 1;
	break;
      }
      
      /* Optimization: if we have seen this initial pattern character before,
	 then it must have failed, and we can skip the pattern */
      if (firstfail && spat[0] == oldp) continue;
      oldp = spat[0];

      /* 
	 ip = index of pattern character being matched
	 ic = index of keyname character being matched
	 firstfail = 1 if we fail on the first characteor (0=not)
      */
      
      for (ip=0, ic=0, firstfail=1;
	   (spat[ip]) && (ic < 8);
	   ip++, ic++, firstfail=0) {
	c = inrec[ic];
	s = spat[ip];

	if (s == 'i') {
	  /* Special pattern: 'i' placeholder */
	  if (isdigit(c)) { i1 = c - '0'; pass = 1;}
	} else if (s == 'j') {
	  /* Special pattern: 'j' placeholder */
	  if (isdigit(c)) { j1 = c - '0'; pass = 1;}
	} else if ((s == 'n')||(s == 'm')||(s == 'l')||(s == '#')) {
	  /* Special patterns: multi-digit number */
          val = 0;
	  pass = 0;
	  if (isdigit(c)) {
	    pass = 1;  /* NOTE, could fail below */
	    
	    /* Parse decimal number */
	    while (ic<8 && isdigit(c)) { 
	      val = val*10 + (c - '0');
	      ic++; c = inrec[ic];
	    }
	    ic--; c = inrec[ic];

	    if (s == 'n' || s == 'm') { 
	      
	      /* Is it a column number? */
	      if ( val >= 1 && val <= 999) {
	         
		 if (val == colnum[0])
		     val = 1; 
		 else if (val == colnum[1]) 
		     val = 2; 
		 else if (val == colnum[2]) 
		     val = 3; 
		 else if (val == colnum[3]) 
		     val = 4; 
		 else {
		     pass = 0;
		     val = 0; 
		 }

	         if (s == 'n')
		    nval = val;
		 else
		    mval = val;
 
              } else {
		  pass = 0;
              }
	    } else if (s == 'l') {
	      /* Generic number */
	      lval = val; 
	    }
	  }
	} else if (s == 'a') {
	  /* Special pattern: coordinate designator */
	  if (isupper(c) || c == ' ') { a = c; pass = 1;} 
	} else if (s == '?') {
	  /* Match any individual character */
	  pass = 1;
	} else if (c == s) {
	  /* Match a specific character */
	  pass = 1;
	} else {
	  /* FAIL */
	  pass = 0;
	}
	
	if (!pass) break;
      }
      

      /* Must pass to the end of the keyword.  No partial matches allowed */
      if (pass && (ic >= 8 || inrec[ic] == ' ')) break;
    }


    /* Transfer the pattern-matched numbers to the output parameters */
    if (i) { *i = i1; }
    if (j) { *j = j1; }
    if (n) { *n = nval; }
    if (m) { *m = mval; }
    if (l) { *l = lval; }
    if (pat_num) { *pat_num = pat; }

    /* ===== Keyword rewriting and output stage */
    spat = patterns[pat][1];

    /* Return case: no match, or explicit deletion pattern */
    if (pass == 0 || spat[0] == '\0' || spat[0] == '-') return 0;

    /* A match: we start by copying the input record to the output */
    strcpy(outrec, inrec);

    /* Return case: return the input record unchanged */
    if (spat[0] == '+') return 0;

    /* Final case: a new output pattern */
    for (ip=0, ic=0; spat[ip]; ip++, ic++) {
      s = spat[ip];
      if (s == 'i') {
	outrec[ic] = (i1+'0');
      } else if (s == 'j') {
	outrec[ic] = (j1+'0');
      } else if (s == 'n' && nval > 0) {
	  for (fac = 1; (nval/fac) > 0; fac *= 10);
	  fac /= 10;
	  while(fac > 0) {
	    outrec[ic] = ((nval/fac) % 10) + '0';
	    fac /= 10;
	    ic ++;
	  }
	  ic--;
      } else if (s == 'm' && mval > 0) {
	  for (fac = 1; (mval/fac) > 0; fac *= 10);
	  fac /= 10;
	  while(fac > 0) {
	    outrec[ic] = ((mval/fac) % 10) + '0';
	    fac /= 10;
	    ic ++;
	  }
	  ic--;
      } else if (s == 'l' && lval >= 0) {
	for (fac = 1; (lval/fac) > 0; fac *= 10);
	fac /= 10;
	while(fac > 0) {
	  outrec[ic] = ((lval/fac) % 10) + '0';
	  fac /= 10;
	  ic ++;
	}
	ic --;
      } else if (s == 'a') {
	outrec[ic] = a;
      } else {
	outrec[ic] = s;
      }
    }

    /* Pad the keyword name with spaces */
    for ( ; ic<8; ic++) { outrec[ic] = ' '; }

    return(*status);
}